

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

char * check_parameter(problem *prob,parameter *param)

{
  uint uVar1;
  char *pcVar2;
  
  if (param->eps <= 0.0) {
    return "eps <= 0";
  }
  if (param->C <= 0.0) {
    return "C <= 0";
  }
  if (param->p <= 0.0 && param->p != 0.0) {
    return "p < 0";
  }
  uVar1 = param->solver_type;
  if ((7 < uVar1) && (2 < uVar1 - 0xb)) {
    return "unknown solver type";
  }
  if (param->init_sol != (double *)0x0) {
    pcVar2 = (char *)0x0;
    if ((uVar1 & 0xfffffffd) != 0) {
      pcVar2 = "Initial-solution specification supported only for solver L2R_LR and L2R_L2LOSS_SVC";
    }
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char *check_parameter(const problem *prob, const parameter *param)
{
	if(param->eps <= 0)
		return "eps <= 0";

	if(param->C <= 0)
		return "C <= 0";

	if(param->p < 0)
		return "p < 0";

	if(param->solver_type != L2R_LR
		&& param->solver_type != L2R_L2LOSS_SVC_DUAL
		&& param->solver_type != L2R_L2LOSS_SVC
		&& param->solver_type != L2R_L1LOSS_SVC_DUAL
		&& param->solver_type != MCSVM_CS
		&& param->solver_type != L1R_L2LOSS_SVC
		&& param->solver_type != L1R_LR
		&& param->solver_type != L2R_LR_DUAL
		&& param->solver_type != L2R_L2LOSS_SVR
		&& param->solver_type != L2R_L2LOSS_SVR_DUAL
		&& param->solver_type != L2R_L1LOSS_SVR_DUAL)
		return "unknown solver type";

	if(param->init_sol != NULL 
		&& param->solver_type != L2R_LR && param->solver_type != L2R_L2LOSS_SVC)
		return "Initial-solution specification supported only for solver L2R_LR and L2R_L2LOSS_SVC";

	return NULL;
}